

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t
internal_exr_calc_header_version_flags(exr_const_context_t_conflict ctxt,uint32_t *flags)

{
  exr_attribute_t *peVar1;
  bool bVar2;
  exr_attr_chlist_entry_t *ce;
  int c;
  int nc;
  exr_attr_chlist_t *chlist;
  exr_attribute_t *cura;
  int a;
  exr_priv_part_t curpart;
  int p;
  int longnamefound;
  uint32_t *flags_local;
  exr_const_context_t_conflict ctxt_local;
  
  *flags = 2;
  if (ctxt->is_multipart != '\0') {
    *flags = *flags | 0x1000;
  }
  if (0x1f < ctxt->max_name_length) {
    bVar2 = false;
    for (p = 0; p < ctxt->num_parts; p = p + 1) {
      for (a = 0; a < (ctxt->parts[p]->attributes).num_attributes; a = a + 1) {
        peVar1 = (ctxt->parts[p]->attributes).entries[a];
        if ((0x1f < peVar1->name_length) || (0x1f < peVar1->type_name_length)) {
          bVar2 = true;
          break;
        }
        if (peVar1->type == EXR_ATTR_CHLIST) {
          for (c = 0; c < ((peVar1->field_6).chlist)->num_channels; c = c + 1) {
            if (0x1f < ((peVar1->field_6).chlist)->entries[c].name.length) {
              bVar2 = true;
              break;
            }
          }
        }
      }
      if (bVar2) break;
    }
    if (bVar2) {
      *flags = *flags | 0x400;
    }
  }
  if (ctxt->has_nonimage_data != '\0') {
    *flags = *flags | 0x800;
  }
  if (ctxt->is_singlepart_tiled != '\0') {
    *flags = *flags | 0x200;
  }
  return 0;
}

Assistant:

exr_result_t internal_exr_calc_header_version_flags (exr_const_context_t ctxt, uint32_t *flags)
{
    *flags = 2; // EXR_VERSION

    if (ctxt->is_multipart) *flags |= EXR_MULTI_PART_FLAG;

    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
    {
        int longnamefound = 0;

        for ( int p = 0; p < ctxt->num_parts; ++p )
        {
            exr_priv_part_t curpart = ctxt->parts[p];
            for ( int a = 0; a < curpart->attributes.num_attributes; ++a )
            {
                exr_attribute_t *cura = curpart->attributes.entries[a];
                if (cura->name_length > EXR_SHORTNAME_MAXLEN ||
                    cura->type_name_length > EXR_SHORTNAME_MAXLEN)
                {
                    longnamefound = 1;
                    break;
                }

                // the original C++ side assumes there was
                // only one channel list (who would have multiple)
                // but let's not make that same assertion and check names
                // if we encounter any channel list named anything
                if (cura->type == EXR_ATTR_CHLIST)
                {
                    const exr_attr_chlist_t* chlist = cura->chlist;
                    int nc = chlist->num_channels;

                    for ( int c = 0; c < nc; ++c )
                    {
                        const exr_attr_chlist_entry_t *ce = chlist->entries + c;
                        if (ce->name.length > EXR_SHORTNAME_MAXLEN)
                        {
                            longnamefound = 1;
                            break;
                        }
                    }
                }
            }

            if (longnamefound)
                break;
        }

        if (longnamefound)
            *flags |= EXR_LONG_NAMES_FLAG;
    }

    if (ctxt->has_nonimage_data) *flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) *flags |= EXR_TILED_FLAG;

    return EXR_ERR_SUCCESS;
}